

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_abort_va(char *format,__va_list_tag *ap)

{
  int iVar1;
  size_t local_f0;
  size_t len;
  char buffer [200];
  int mpi_init;
  __va_list_tag *ap_local;
  char *format_local;
  
  buffer[0xc4] = '\0';
  buffer[0xc5] = '\0';
  buffer[0xc6] = '\0';
  buffer[199] = '\0';
  MPI_Initialized(buffer + 0xc4);
  s_aborting = true;
  if (s_expect_abort_msg != (char *)0x0) {
    vsnprintf((char *)&len,200,format,ap);
    local_f0 = strlen(s_expect_abort_msg);
    if (200 < local_f0) {
      local_f0 = 200;
    }
    iVar1 = strncmp((char *)&len,s_expect_abort_msg,local_f0);
    if (iVar1 == 0) {
      s_expect_abort_msg = (char *)0x0;
      if (buffer._196_4_ == 0) {
        exit(0);
      }
      MPI_Abort(&ompi_mpi_comm_world,0);
    }
    fprintf(_stderr,
            "Test did indeed abort, but produced wrong message.\n  Expected: \'%s...\'\n    Actual: \'%s\'\n"
            ,s_expect_abort_msg,&len);
  }
  fflush(_stdout);
  fsync(1);
  vfprintf(_stderr,format,ap);
  fflush(_stderr);
  fsync(2);
  if (buffer._196_4_ != 0) {
    MPI_Abort(&ompi_mpi_comm_world,6);
    return;
  }
  abort();
}

Assistant:

void bsp_abort_va( const char * format, va_list ap )
{
    int mpi_init = 0;
    MPI_Initialized( & mpi_init );

    s_aborting = true;

    if (s_expect_abort_msg) {
        char buffer[200];
        std::vsnprintf(buffer, sizeof(buffer), format, ap );
        size_t len = strlen( s_expect_abort_msg );
        if (len > sizeof(buffer)) len = sizeof(buffer);
        // test equality of prefix
        if ( strncmp( buffer, s_expect_abort_msg, len ) == 0 ) {
            s_expect_abort_msg = NULL;
            if (mpi_init)
                MPI_Abort(MPI_COMM_WORLD, EXIT_SUCCESS );
            else
                std::exit(EXIT_SUCCESS);
        }
        std::fprintf( stderr, "Test did indeed abort, but produced wrong message.\n"
                "  Expected: '%s...'\n"
                "    Actual: '%s'\n", s_expect_abort_msg, buffer  );
    }
    std::fflush(stdout);
#if HAS_UNISTD
    fsync(STDOUT_FILENO);
#endif
    std::vfprintf(stderr, format, ap );
    std::fflush(stderr);
#if HAS_UNISTD
    fsync(STDERR_FILENO);
#endif

    if (mpi_init)
        MPI_Abort(MPI_COMM_WORLD, 6 );
    else
        std::abort();
}